

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O1

Belief * __thiscall despot::Navigation::InitialBelief(Navigation *this,State *start,string type)

{
  ParticleBelief *pPVar1;
  int iVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_40;
  State *local_28;
  
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 1000;
  do {
    local_28 = (State *)(**(code **)(*(long *)this + 0xa8))(0xd2f1a9fc,this,0);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&local_58,&local_28);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  pPVar1 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_40,&local_58);
  despot::ParticleBelief::ParticleBelief(pPVar1,&local_40,this,0,1);
  if (local_40.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)pPVar1;
}

Assistant:

Belief* Navigation::InitialBelief(const State* start, string type) const {
	vector<State*> particles;

	for (int i = 0; i < 1000; i++)
		particles.push_back(static_cast<NavigationState*>(Allocate(0, 0.001)));

	Belief* belief = new ParticleBelief(particles, this);
	return belief;
}